

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_fruinfo.c
# Opt level: O3

uint8_t * IpmiFruAddString(uint8_t *pos,char *str)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  uint8_t *__dest;
  
  sVar3 = strlen(str);
  iVar1 = (int)sVar3;
  iVar4 = 0x3f;
  if (iVar1 < 0x3f) {
    iVar4 = iVar1;
  }
  iVar2 = 2;
  if (iVar1 != 1) {
    iVar2 = iVar4;
  }
  *pos = (char)iVar2 + 0xc0;
  __dest = pos + 1;
  if (iVar2 != 0) {
    memcpy(__dest,str,(long)iVar2);
    __dest = __dest + iVar2;
  }
  return __dest;
}

Assistant:

uint8_t *IpmiFruAddString(uint8_t *pos, const char *str)
{
    int len = strlen(str);
    if (len == 1) {
        len ++;
    } else if (len > 63) {
        len = 63;
    }
    *pos++ = 0xC0 + len;
    if (len) {
        memcpy(pos, str, len);
        pos += len;
    }
    return pos;
}